

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O1

void __thiscall n_e_s::core::Mos6502::execute(Mos6502 *this)

{
  deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  *pdVar1;
  uint64_t *puVar2;
  bool bVar3;
  Pipeline local_70;
  
  bVar3 = Pipeline::done(&this->pipeline_);
  if (bVar3) {
    pdVar1 = &(this->pipeline_).steps_;
    if (this->nmi_ == true) {
      create_nmi(&local_70,this);
      (this->pipeline_).continue_ = local_70.continue_;
      std::
      deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
      ::_M_move_assign1(pdVar1,&local_70.steps_);
      std::
      deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
      ::~deque(&local_70.steps_);
      this->nmi_ = false;
    }
    else {
      parse_next_instruction(&local_70,this);
      (this->pipeline_).continue_ = local_70.continue_;
      std::
      deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
      ::_M_move_assign1(pdVar1,&local_70.steps_);
      std::
      deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
      ::~deque(&local_70.steps_);
    }
  }
  else {
    Pipeline::execute_step(&this->pipeline_);
  }
  puVar2 = &(this->state_).cycle;
  *puVar2 = *puVar2 + 1;
  return;
}

Assistant:

void Mos6502::execute() {
    if (pipeline_.done()) {
        if (nmi_) {
            pipeline_ = create_nmi();
            nmi_ = false;
        } else {
            pipeline_ = parse_next_instruction();
        }
    } else {
        pipeline_.execute_step();
    }
    ++state_.cycle;
}